

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  int iVar2;
  char *__s2;
  ossl_gost_cipher_ctx *c;
  long lVar3;
  int iVar4;
  
  if (type == 0x20) {
    lVar3 = EVP_CIPHER_CTX_get_cipher_data();
    if (lVar3 == 0) {
      return -1;
    }
    if (*(int *)(lVar3 + 4) != 0) {
      return -1;
    }
    *(int *)(lVar3 + 8) = arg;
LAB_0011350f:
    iVar2 = 1;
  }
  else {
    if (type == 7) {
      if (ptr != (void *)0x0) {
        __s2 = get_gost_engine_param(1);
        uVar1 = 0x3dd;
        if (__s2 != (char *)0x0) {
          iVar2 = strcmp("md_gost12_256",__s2);
          if (iVar2 == 0) {
            uVar1 = 0x3dc;
          }
          else {
            iVar2 = strcmp("md_gost12_512",__s2);
            if (iVar2 != 0) {
              iVar2 = strcmp("md_gost94",__s2);
              uVar1 = 0x3dd;
              if (iVar2 == 0) {
                uVar1 = 0x32a;
              }
            }
          }
        }
        *(undefined4 *)ptr = uVar1;
        return 1;
      }
      return 0;
    }
    if (type == 0x1e) {
      if (ptr == (void *)0x0) {
        return 0;
      }
      c = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
      if (c == (ossl_gost_cipher_ctx *)0x0) {
        return -1;
      }
      if (c->count != 0) {
        return -1;
      }
      iVar2 = OBJ_txt2nid((char *)ptr);
      if (iVar2 == 0) {
        return 0;
      }
      iVar4 = c->key_meshing;
      iVar2 = gost_cipher_set_param(c,iVar2);
      c->key_meshing = iVar4;
      return iVar2;
    }
    if (type == 6) {
      uVar1 = EVP_CIPHER_CTX_get_key_length();
      iVar2 = RAND_priv_bytes(ptr,uVar1);
      if (0 < iVar2) goto LAB_0011350f;
      iVar4 = 0x7e;
      iVar2 = 0x488;
    }
    else {
      iVar4 = 0x82;
      iVar2 = 0x4cd;
    }
    ERR_GOST_error(0x6a,iVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_crypt.c"
                   ,iVar2);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int gost_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:
        {
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_GOST_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
        }
    case EVP_CTRL_PBE_PRF_NID:
        if (ptr) {
            const char *params = get_gost_engine_param(GOST_PARAM_PBE_PARAMS);
            int nid = NID_id_tc26_hmac_gost_3411_2012_512;

            if (params) {
                if (!strcmp("md_gost12_256", params))
                    nid = NID_id_tc26_hmac_gost_3411_2012_256;
                else if (!strcmp("md_gost12_512", params))
                    nid = NID_id_tc26_hmac_gost_3411_2012_512;
                else if (!strcmp("md_gost94", params))
                    nid = NID_id_HMACGostR3411_94;
            }
            *((int *)ptr) = nid;
            return 1;
        } else {
            return 0;
        }

    case EVP_CTRL_SET_SBOX:
        if (ptr) {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);
            int nid;
            int cur_meshing;
            int ret;

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            nid = OBJ_txt2nid(ptr);
            if (nid == NID_undef) {
                return 0;
            }

            cur_meshing = c->key_meshing;
            ret = gost_cipher_set_param(c, nid);
            c->key_meshing = cur_meshing;
            return ret;
        } else {
            return 0;
        }
    case EVP_CTRL_KEY_MESH:
        {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            c->key_meshing = arg;
            return 1;
        }
    default:
        GOSTerr(GOST_F_GOST_CIPHER_CTL, GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}